

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamReaderPrivate::LoadNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  value_type *__x;
  size_type __n;
  BamReaderPrivate *in_RSI;
  RaiiBuffer *in_RDI;
  uint i_1;
  CigarOp op;
  uint32_t *cigarData;
  uint cigarDataOffset;
  int OldNumCigarOperations;
  RaiiBuffer allCharData;
  uint dataLength;
  bool readCharDataOK;
  uint tempValue;
  uint i;
  char x [32];
  char buffer [4];
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  size_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  size_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ulong local_68;
  bool local_51;
  byte bStack_4f;
  undefined2 uStack_4e;
  uint local_4c;
  RaiiBuffer *in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffe4;
  bool local_1;
  
  uVar4 = 0;
  std::fill_n<char*,unsigned_long,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(int *)in_RDI);
  BgzfStream::Read((BgzfStream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  uVar1 = UnpackUnsignedInt((char *)0x1c1d84);
  *(uint *)((long)&(in_RSI->m_header).m_header.ReadGroups.m_data.
                   super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>
                   ._M_impl.super__Vector_impl_data + 0x10) = uVar1;
  if (((ulong)in_RDI[4].Buffer & 1) != 0) {
    SwapEndian_32((uint32_t *)
                  ((long)&(in_RSI->m_header).m_header.ReadGroups.m_data.
                          super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>
                          ._M_impl.super__Vector_impl_data + 0x10));
  }
  if (*(int *)((long)&(in_RSI->m_header).m_header.ReadGroups.m_data.
                      super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>
                      ._M_impl.super__Vector_impl_data + 0x10) == 0) {
    local_1 = false;
  }
  else {
    sVar3 = BgzfStream::Read((BgzfStream *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff78);
    if (sVar3 == 0x20) {
      if (((ulong)in_RDI[4].Buffer & 1) != 0) {
        for (local_4c = 0; local_4c < 0x20; local_4c = local_4c + 4) {
          SwapEndian_32p((char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
        }
      }
      iVar2 = UnpackSignedInt((char *)0x1c1e48);
      *(int *)((long)&(in_RSI->m_header).m_header.GroupOrder.field_2 + 8) = iVar2;
      iVar2 = UnpackSignedInt((char *)0x1c1e62);
      *(int *)((long)&(in_RSI->m_header).m_header.GroupOrder.field_2 + 0xc) = iVar2;
      uVar1 = UnpackUnsignedInt((char *)0x1c1e7c);
      uStack_4e = (undefined2)(uVar1 >> 0x10);
      *(undefined2 *)
       &(in_RSI->m_header).m_header.CustomTags.
        super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>.
        _M_impl.super__Vector_impl_data._M_start = uStack_4e;
      bStack_4f = (byte)(uVar1 >> 8);
      *(ushort *)
       ((long)&(in_RSI->m_header).m_header.CustomTags.
               super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>
               ._M_impl.super__Vector_impl_data._M_start + 2) = (ushort)bStack_4f;
      *(uint *)&(in_RSI->m_header).m_header.ReadGroups.m_lookupData._M_t._M_impl = uVar1 & 0xff;
      uVar1 = UnpackUnsignedInt((char *)0x1c1ec8);
      *(uint *)((long)&(in_RSI->m_header).m_header.CustomTags.
                       super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4) = uVar1 >> 0x10;
      *(uint *)((long)&(in_RSI->m_header).m_header.ReadGroups.m_data.
                       super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>
                       ._M_impl.super__Vector_impl_data + 0x14) = uVar1 & 0xffff;
      uVar1 = UnpackUnsignedInt((char *)0x1c1eff);
      *(uint *)&(in_RSI->m_header).m_header.ReadGroups.m_lookupData._M_t._M_impl.field_0x4 = uVar1;
      iVar2 = UnpackSignedInt((char *)0x1c1f1c);
      *(int *)((long)&(in_RSI->m_header).m_header.Sequences.m_data.
                      super__Vector_base<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>
                      ._M_impl.super__Vector_impl_data + 8) = iVar2;
      iVar2 = UnpackSignedInt((char *)0x1c1f39);
      *(int *)((long)&(in_RSI->m_header).m_header.Sequences.m_data.
                      super__Vector_base<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>
                      ._M_impl.super__Vector_impl_data + 0xc) = iVar2;
      iVar2 = UnpackSignedInt((char *)0x1c1f56);
      *(int *)((long)&(in_RSI->m_header).m_header.Sequences.m_data.
                      super__Vector_base<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>
                      ._M_impl.super__Vector_impl_data + 0x10) = iVar2;
      *(undefined4 *)((long)&(in_RSI->m_filename).field_2 + 8) =
           *(undefined4 *)
            &(in_RSI->m_header).m_header.ReadGroups.m_lookupData._M_t._M_impl.field_0x4;
      local_51 = false;
      iVar2 = *(int *)((long)&(in_RSI->m_header).m_header.ReadGroups.m_data.
                              super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>
                              ._M_impl.super__Vector_impl_data + 0x10);
      RaiiBuffer::RaiiBuffer(in_RDI,in_stack_ffffffffffffff58);
      __x = (value_type *)
            BgzfStream::Read((BgzfStream *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff78);
      if (__x == (value_type *)(ulong)(iVar2 - 0x20)) {
        in_stack_ffffffffffffff57 =
             Tag2Cigar(in_RSI,(BamAlignment *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),
                       in_stack_ffffffffffffffd8);
        std::__cxx11::string::assign
                  ((char *)((long)&(in_RSI->m_header).m_header.Sequences.m_lookupData._M_t._M_impl.
                                   super__Rb_tree_header + 0x18),local_68);
        local_51 = true;
        uVar1 = *(uint *)&(in_RSI->m_header).m_header.ReadGroups.m_lookupData._M_t._M_impl;
        __n = local_68 + uVar1;
        CigarOp::CigarOp((CigarOp *)&stack0xffffffffffffff70,'\0',
                         (uint32_t *)&stack0xffffffffffffff6c);
        std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::clear
                  ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)0x1c20ba);
        std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::reserve
                  ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                   CONCAT44(uVar1,in_stack_ffffffffffffff80),__n);
        for (uVar1 = 0;
            uVar1 < *(uint *)((long)&(in_RSI->m_header).m_header.ReadGroups.m_data.
                                     super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>
                                     ._M_impl.super__Vector_impl_data + 0x14); uVar1 = uVar1 + 1) {
          if (((ulong)in_RDI[4].Buffer & 1) != 0) {
            SwapEndian_32((uint32_t *)(__n + (ulong)uVar1 * 4));
          }
          std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::push_back
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)in_RDI,__x);
        }
      }
      local_1 = local_51;
      RaiiBuffer::~RaiiBuffer
                ((RaiiBuffer *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool BamReaderPrivate::LoadNextAlignment(BamAlignment& alignment)
{

    // read in the 'block length' value, make sure it's not zero
    char buffer[sizeof(uint32_t)];
    std::fill_n(buffer, sizeof(uint32_t), 0);
    m_stream.Read(buffer, sizeof(uint32_t));
    alignment.SupportData.BlockLength = BamTools::UnpackUnsignedInt(buffer);
    if (m_isBigEndian) BamTools::SwapEndian_32(alignment.SupportData.BlockLength);
    if (alignment.SupportData.BlockLength == 0) return false;

    // read in core alignment data, make sure the right size of data was read
    char x[Constants::BAM_CORE_SIZE];
    if (m_stream.Read(x, Constants::BAM_CORE_SIZE) != Constants::BAM_CORE_SIZE) return false;

    // swap core endian-ness if necessary
    if (m_isBigEndian) {
        for (unsigned int i = 0; i < Constants::BAM_CORE_SIZE; i += sizeof(uint32_t))
            BamTools::SwapEndian_32p(&x[i]);
    }

    // set BamAlignment 'core' and 'support' data
    alignment.RefID = BamTools::UnpackSignedInt(&x[0]);
    alignment.Position = BamTools::UnpackSignedInt(&x[4]);

    unsigned int tempValue = BamTools::UnpackUnsignedInt(&x[8]);
    alignment.Bin = tempValue >> 16;
    alignment.MapQuality = tempValue >> 8 & 0xff;
    alignment.SupportData.QueryNameLength = tempValue & 0xff;

    tempValue = BamTools::UnpackUnsignedInt(&x[12]);
    alignment.AlignmentFlag = tempValue >> 16;
    alignment.SupportData.NumCigarOperations = tempValue & 0xffff;

    alignment.SupportData.QuerySequenceLength = BamTools::UnpackUnsignedInt(&x[16]);
    alignment.MateRefID = BamTools::UnpackSignedInt(&x[20]);
    alignment.MatePosition = BamTools::UnpackSignedInt(&x[24]);
    alignment.InsertSize = BamTools::UnpackSignedInt(&x[28]);

    // set BamAlignment length
    alignment.Length = alignment.SupportData.QuerySequenceLength;

    // read in character data - make sure proper data size was read
    bool readCharDataOK = false;
    unsigned int dataLength = alignment.SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    RaiiBuffer allCharData(dataLength);

    if (m_stream.Read(allCharData.Buffer, dataLength) == dataLength) {

        int OldNumCigarOperations = alignment.SupportData.NumCigarOperations;
        if (Tag2Cigar(alignment, allCharData)) dataLength -= 8 + OldNumCigarOperations * 4;

        // store 'allCharData' in supportData structure
        alignment.SupportData.AllCharData.assign((const char*)allCharData.Buffer, dataLength);

        // set success flag
        readCharDataOK = true;

        // save CIGAR ops
        // need to calculate this here so that  BamAlignment::GetEndPosition() performs correctly,
        // even when GetNextAlignmentCore() is called
        const unsigned int cigarDataOffset = alignment.SupportData.QueryNameLength;
        uint32_t* cigarData = (uint32_t*)(allCharData.Buffer + cigarDataOffset);
        CigarOp op;
        alignment.CigarData.clear();
        alignment.CigarData.reserve(alignment.SupportData.NumCigarOperations);
        for (unsigned int i = 0; i < alignment.SupportData.NumCigarOperations; ++i) {

            // swap endian-ness if necessary
            if (m_isBigEndian) BamTools::SwapEndian_32(cigarData[i]);

            // build CigarOp structure
            op.Length = (cigarData[i] >> Constants::BAM_CIGAR_SHIFT);
            op.Type = Constants::BAM_CIGAR_LOOKUP[(cigarData[i] & Constants::BAM_CIGAR_MASK)];

            // save CigarOp
            alignment.CigarData.push_back(op);
        }
    }

    // return success/failure
    return readCharDataOK;
}